

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O2

pcp_flow_event_e fhndl_clear_timeouts(pcp_flow_t *f,pcp_recv_msg_t *msg)

{
  if (msg != (pcp_recv_msg_t *)0x0) {
    f->recv_result = msg->recv_result;
  }
  pcp_flow_clear_msg_buf(f);
  (f->timeout).tv_sec = 0;
  (f->timeout).tv_usec = 0;
  return fev_none;
}

Assistant:

static pcp_flow_event_e fhndl_clear_timeouts(pcp_flow_t *f,
                                             pcp_recv_msg_t *msg) {
    if (msg) {
        f->recv_result = msg->recv_result;
    }
    pcp_flow_clear_msg_buf(f);
    f->timeout.tv_sec = 0;
    f->timeout.tv_usec = 0;

    return fev_none;
}